

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

uint32_t __thiscall ddd::DaTrie<false,_true,_false>::num_singles(DaTrie<false,_true,_false> *this)

{
  pointer pBVar1;
  size_t sVar2;
  uint32_t uVar3;
  uint32_t i;
  ulong uVar4;
  
  uVar3 = 0;
  for (uVar4 = 0;
      pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < ((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 3 &
              0xffffffff); uVar4 = uVar4 + 1) {
    if ((long)pBVar1[uVar4] < 0) {
      sVar2 = edge_size_(this,(uint32_t)uVar4,2);
      uVar3 = uVar3 + (sVar2 == 1);
    }
  }
  return uVar3;
}

Assistant:

uint32_t num_singles() const { // not in constant time
    uint32_t ret = 0;
    for (uint32_t i = 0; i < bc_size(); ++i) {
      if (!bc_[i].is_fixed()) {
        continue;
      }
      if (edge_size_(i, 2) == 1) {
        ++ret;
      }
    }
    return ret;
  }